

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_parser.cpp
# Opt level: O2

void __thiscall franca::ModelParser::ModelParser(ModelParser *this)

{
  Rule<ast::Model_()> *this_00;
  string *this_01;
  Rule<std::string_()> *this_02;
  Rule<std::string_()> *this_03;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  eVar1;
  actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,_boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::phoenix::detail::function_ptr<void,_void_(*)(const_char_*,_const_char_*,_const_char_*,_const_boost::spirit::info_&)>_>,_0L>,_boost::phoenix::actor<boost::spirit::argument<0>_>,_boost::phoenix::actor<boost::spirit::argument<1>_>,_boost::phoenix::actor<boost::spirit::argument<2>_>,_boost::phoenix::actor<boost::spirit::argument<3>_>_>,_5L>_>
  f;
  reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
  rVar2;
  AnnotationGrammar *pAVar3;
  reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
  rVar4;
  TypeDefinitionParser *pTVar5;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  eVar6;
  reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
  rVar7;
  Rule<ast::Error_()> *pRVar8;
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  *prVar9;
  InitializerParser *pIVar10;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[3]>_>_>,_0L>
  that;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[6]>_>_>,_0L>
  that_2;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,_boost::spirit::char_encoding::standard>,_boost::fusion::vector<char>_>_>,_0L>
  that_14;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[6]>_>_>,_0L>
  that_3;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_4;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<char>_>_>,_0L>
  that_5;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[3]>_>_>,_0L>
  that_6;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,_boost::fusion::vector<const_char_(&)[4]>_>_>,_0L>
  that_7;
  proto_child0 pVar11;
  undefined1 *puVar12;
  undefined1 local_243;
  char local_242;
  undefined1 local_241;
  proto_child0 local_240;
  proto_child0 local_238;
  string local_230;
  proto_child0 local_210;
  proto_child0 local_208;
  proto_child0 local_200;
  proto_child0 local_1f8;
  Rule<std::string_()> *local_1f0;
  proto_child0 local_1e8;
  undefined1 local_1e0 [24];
  undefined1 local_1c8 [16];
  vtable_base *local_1b8;
  function_buffer local_1b0;
  rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_190;
  undefined1 local_188 [32];
  vtable_base local_168;
  vtable_base *local_160;
  undefined1 local_158 [16];
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  local_148;
  AnnotationGrammar *local_140;
  Rule<std::string_()> *local_138;
  reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
  local_130;
  Rule<ast::Interface_()> *local_128;
  reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
  local_120;
  Rule<ast::TypeCollection_()> *local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_108;
  AnnotationGrammar *local_100;
  reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
  local_f8;
  TypeDefinitionParser *local_f0;
  expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>
  local_e8;
  reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
  local_e0;
  Rule<ast::Error_()> *local_d8;
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_d0;
  InitializerParser *local_c8;
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_c0;
  ExpressionParser *local_b8;
  TypeDefinitionParser *local_b0;
  proto_child0 local_a8;
  TypeDefinitionParser *local_a0;
  TypeDefinitionParser *local_98;
  vtable_base local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  *local_78;
  vtable_base local_70;
  char *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60 [2];
  Rule<std::string_()> *local_50;
  string *local_48;
  vtable_base local_40;
  Rule<ast::Error_()> *local_38;
  
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-grammar",(allocator *)&stack0xfffffffffffffda8);
  this_00 = &this->model_;
  (this->
  super_grammar<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ).
  super_extends<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,_boost::proto::argsns_::term<boost::spirit::qi::reference<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>_>,_0L>,_boost::spirit::qi::grammar<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>,_boost::proto::domainns_::default_domain,_0L>
  .proto_expr_.child0.ref.t_ = this_00;
  this_01 = &(this->
             super_grammar<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
             ).name_;
  std::__cxx11::string::string((string *)this_01,(string *)&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  local_48 = this_01;
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-rule",(allocator *)&stack0xfffffffffffffda8);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_00,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  local_c0 = this_00;
  TypeParser::TypeParser(&this->type_);
  local_f8.t_ = (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
                 *)&this->type_;
  TypeDefinitionParser::TypeDefinitionParser(&this->type_definition_);
  local_b8 = &this->expression_;
  local_f0 = &this->type_definition_;
  ExpressionParser::ExpressionParser(local_b8);
  InitializerParser::InitializerParser(&this->initializer_);
  local_b0 = (TypeDefinitionParser *)&this->contract_;
  local_c8 = &this->initializer_;
  ContractParser::ContractParser((ContractParser *)local_b0);
  local_100 = &this->annotation_;
  AnnotationGrammar::AnnotationGrammar(local_100);
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-rule",(allocator *)&stack0xfffffffffffffda8);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->version_,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  local_d0 = &this->version_;
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-rule",(allocator *)&stack0xfffffffffffffda8);
  this_02 = &this->import_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_02,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  local_50 = this_02;
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-rule",(allocator *)&stack0xfffffffffffffda8);
  local_108 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&this->attribute_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Attribute_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Attribute_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_108,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-rule",(allocator *)&stack0xfffffffffffffda8);
  local_188._24_8_ = &this->argument_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Argument_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_188._24_8_,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-rule",(allocator *)&stack0xfffffffffffffda8);
  local_d8 = &this->error_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_boost::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<fidler::ast::Enumerator,_std::allocator<fidler::ast::Enumerator>_>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(local_d8,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-rule",(allocator *)&stack0xfffffffffffffda8);
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(&this->enumerator_,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  local_e0.t_ = (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
                 *)&this->enumerator_;
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-rule",(allocator *)&stack0xfffffffffffffda8);
  local_110 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)&this->method_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_110,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-rule",(allocator *)&stack0xfffffffffffffda8);
  local_120.t_ = (rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
                  *)&this->broadcast_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Broadcast_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_120.t_,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-rule",(allocator *)&stack0xfffffffffffffda8);
  local_130.t_ = (rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
                  *)&this->constant_def_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<const_char_*,_franca::SkipGrammar,_fidler::ast::ConstantDef_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_130.t_,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-rule",(allocator *)&stack0xfffffffffffffda8);
  local_118 = &this->type_collection_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(local_118,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-rule",(allocator *)&stack0xfffffffffffffda8);
  local_128 = &this->interface_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(local_128,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-rule",(allocator *)&stack0xfffffffffffffda8);
  local_138 = &this->quoted_string_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(local_138,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-rule",(allocator *)&stack0xfffffffffffffda8);
  this_03 = &this->fqn_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule(this_03,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  local_188._16_8_ = this_03;
  std::__cxx11::string::string
            ((string *)&local_230,"unnamed-rule",(allocator *)&stack0xfffffffffffffda8);
  local_e8.child0.ref.t_ = (proto_child0)&this->id_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::rule((rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)local_e8.child0.ref.t_,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  local_1f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_210;
  local_208.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_168;
  local_240.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_200;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x613fde;
  local_1c8._8_8_ = &local_1f0;
  local_1e8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )local_188;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(local_1e0 + 0x20);
  eVar1.child0.ref.t_ = (proto_child0)((long)local_1e0 + 0x10);
  local_1e0._16_8_ = local_118;
  local_1c8._0_8_ = &local_148;
  local_1e0._8_8_ = &local_1b0;
  local_1b0.members.obj_ptr = local_128;
  local_1b0._8_8_ = local_158;
  local_230._M_string_length = (size_type)&boost::spirit::eoi;
  local_198 = (rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_1e0;
  local_230._M_dataplus._M_p = &stack0xfffffffffffffda8;
  local_210.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )this_03;
  local_1f0 = this_02;
  local_1e0._0_8_ = eVar1.child0.ref.t_;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Model_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_3b32745e_>(this_00,&local_230);
  pTVar5 = local_f0;
  pAVar3 = local_100;
  local_1e0._0_8_ = ".*";
  local_1e0._16_8_ = local_1e0;
  local_210.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1f0;
  local_208.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x613ff6;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x613fed;
  local_1f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_210;
  local_240.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&boost::spirit::omit;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_200;
  local_230._M_string_length = (size_type)local_138;
  local_230._M_dataplus._M_p = &stack0xfffffffffffffda8;
  local_1f0 = this_03;
  local_1e8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )eVar1.child0.ref.t_;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<false>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[7]>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::omit>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[6]>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[3]>>>,0l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[5]>,0l>>,2l>const&>,2l>const&>,2l>const&>,2l>const&,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>>
            (this_02);
  prVar9 = local_d0;
  eVar6.child0.ref.t_ = local_e8.child0.ref.t_;
  rVar2.t_ = local_130.t_;
  local_1e0._0_8_ = "typeCollection";
  local_1e0._8_8_ = pAVar3;
  local_1e0._16_8_ = local_e8.child0.ref.t_;
  local_1f0 = (Rule<std::string_()> *)local_1e0;
  local_188[0] = 0x7b;
  local_210.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1f0;
  local_1b0.members.obj_ptr = local_d0;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_210;
  local_1f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1b0;
  local_1c8._8_8_ = pTVar5;
  local_240.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_200;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(local_1e0 + 0x20);
  local_198 = local_130.t_;
  local_148.child0.ref.t_._0_1_ = 0x7d;
  local_230._M_dataplus._M_p = &stack0xfffffffffffffda8;
  local_230._M_string_length = (size_type)&local_148;
  local_208.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_188;
  local_1e8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )eVar1.child0.ref.t_;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::TypeCollection(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[15]>,0l>,franca::AnnotationGrammar&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,fidler::ast::Version(),boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<franca::TypeDefinitionParser&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,fidler::ast::ConstantDef(),boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_118);
  local_148.child0.ref.t_ =
       (proto_child0)
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )0x613ffb;
  local_140 = pAVar3;
  local_188._8_8_ = eVar6.child0.ref.t_;
  local_158._0_8_ = "extends";
  local_158._8_8_ = local_188._16_8_;
  local_190 = local_60;
  local_60[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_158;
  local_68 = &local_241;
  local_241 = 0x2c;
  local_160 = &local_70;
  local_70.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       eVar6.child0.ref.t_;
  local_168.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)0x61400d
  ;
  local_1b8 = &stack0xffffffffffffffc0;
  local_40.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_168;
  local_1b0._8_8_ = &local_242;
  local_242 = '{';
  local_1b0.members._0_8_ = (undefined8)(local_1e0 + 0x20);
  local_1c8._0_8_ = &local_78;
  local_78 = prVar9;
  local_1e0._16_8_ = &local_1b0;
  local_1e0._8_8_ = &local_80;
  local_80 = local_108;
  local_1e0._0_8_ = (long)local_1e0 + 0x10;
  local_1e8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_88;
  local_88 = local_110;
  local_1f0 = (Rule<std::string_()> *)local_1e0;
  local_208.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_90;
  local_90.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       local_120.t_;
  local_210.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1f0;
  local_1f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_98;
  local_98 = local_b0;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_210;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_a0;
  local_a0 = local_f0;
  local_240.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_200;
  local_a8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )rVar2.t_;
  local_230._M_string_length = (size_type)&local_243;
  local_243 = 0x7d;
  local_230._M_dataplus._M_p = &stack0xfffffffffffffda8;
  local_1c8._8_8_ = &local_198;
  local_198 = (rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_188;
  local_188._0_8_ = &local_148;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Interface_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_9ff26b60_>(local_128);
  local_1e0._0_8_ = "version";
  local_1c8[8] = 0x7b;
  local_1f0 = (Rule<std::string_()> *)local_1e0;
  local_1e8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(local_1e0 + 0x20);
  local_1e0._16_8_ = "major";
  local_208.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(local_1e0 + 0x10);
  local_1f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&boost::spirit::int_;
  local_1b0.members.obj_ptr = "minor";
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1b0;
  local_198._0_1_ = 0x7d;
  local_240.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_200;
  local_230._M_dataplus._M_p = &stack0xfffffffffffffda8;
  local_230._M_string_length = (size_type)&local_198;
  local_210.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_1f0;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_210;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::Version(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[8]>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[6]>>>,0l>const&>,2l>const&,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char_const(&)[6]>>>,0l>const&>,2l>const&,boost::spirit::terminal<boost::spirit::tag::int_>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (prVar9);
  pAVar3 = local_100;
  local_1f0 = (Rule<std::string_()> *)0x614029;
  local_1e8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_100;
  local_208.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_f8.t_;
  local_198 = (rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)CONCAT71(local_198._1_7_,0x5b);
  local_188[0] = 0x5d;
  local_1e0._0_8_ = &boost::spirit::matches;
  local_1e0._8_8_ = local_1e0 + 0x10;
  local_1f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )local_1e0;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )eVar6.child0.ref.t_;
  local_1b0.members.obj_ptr = &boost::spirit::matches;
  local_1b0._8_8_ = (long)" readonly" + 1;
  local_1c8._8_8_ = &boost::spirit::matches;
  local_1b8 = (vtable_base *)0x610d43;
  local_230._M_string_length = (size_type)(local_1e0 + 0x20);
  local_240.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_200;
  local_230._M_dataplus._M_p = &stack0xfffffffffffffda8;
  local_210.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_1f0;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)&local_210;
  local_1e0._16_8_ = &local_198;
  local_1c8._0_8_ =
       (rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
        *)local_188;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::Attribute(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[10]>,0l>,franca::AnnotationGrammar&>,2l>const&,franca::TypeParser&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::matches>,0l>const&,boost::proto::___st::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[16]>,0l>>,2l>const&>,2l>>
            (local_108);
  pRVar8 = local_d8;
  local_1e0._16_8_ = "method";
  local_1b0.members.obj_ptr = &boost::spirit::matches;
  local_1b0._8_8_ = (long)" fireAndForget" + 1;
  local_208.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_a0;
  local_148.child0.ref.t_ =
       (proto_child0)
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )0x610d70;
  local_188._0_8_ = &local_148;
  local_188._8_8_ = &local_a8;
  local_190 = &local_80;
  local_1c8._8_8_ = &local_198;
  local_1b8 = (vtable_base *)&local_241;
  local_1f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_78;
  local_70.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)local_60
  ;
  local_68 = &local_242;
  local_168.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       &local_70;
  local_160 = &local_90;
  local_158._0_8_ = &local_168;
  local_158._8_8_ = &local_243;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_88;
  local_40.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)0x610d7f
  ;
  local_1c8._0_8_ = pAVar3;
  local_1e0._0_8_ = (long)local_1e0 + 0x10;
  local_1e0._8_8_ = eVar6.child0.ref.t_;
  local_1f0 = (Rule<std::string_()> *)local_1e0;
  local_1e8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1b0;
  local_98 = (TypeDefinitionParser *)&stack0xffffffffffffffc0;
  local_a0 = (TypeDefinitionParser *)CONCAT71(local_a0._1_7_,0x7b);
  local_a8.ref.t_._0_1_ = 0x7b;
  local_80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_188._24_8_;
  local_241 = 0x7d;
  local_78 = (rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Version_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
              *)(local_1e0 + 0x20);
  local_242 = '{';
  local_243 = 0x7d;
  local_230._M_string_length = (long)&local_1b0 + 0x17;
  local_1b0.data[0x17] = '}';
  local_60[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x610d77;
  local_90.manager =
       (_func_void_function_buffer_ptr_function_buffer_ptr_functor_manager_operation_type *)
       local_188._24_8_;
  local_88 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_158;
  local_38 = local_d8;
  local_240.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_200;
  local_230._M_dataplus._M_p = &stack0xfffffffffffffda8;
  local_210.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)&local_1f0;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_210;
  local_198 = (rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)local_188;
  boost::spirit::qi::
  rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Method_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
  ::define<_f7f04a1c_>(local_110);
  rVar7.t_ = local_e0.t_;
  local_210.ref.t_._0_1_ = 0x7b;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_e0.t_;
  local_1f0 = (Rule<std::string_()> *)CONCAT71(local_1f0._1_7_,0x7d);
  local_230._M_dataplus._M_p = (pointer)local_188._16_8_;
  local_240.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)&local_210;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_200;
  local_230._M_string_length = (size_type)&stack0xfffffffffffffda8;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,boost::variant<std::__cxx11::string,std::vector<fidler::ast::Enumerator,std::allocator<fidler::ast::Enumerator>>>(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,fidler::ast::Enumerator(),boost::spirit::unused_type,boost::spirit::unused_type>&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,2l>>
            (pRVar8);
  local_200.ref.t_._0_1_ = 0x3d;
  local_230._M_dataplus._M_p = (pointer)eVar6.child0.ref.t_;
  local_230._M_string_length = (size_type)&local_240;
  local_240.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)&stack0xfffffffffffffda8;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::Enumerator(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>,franca::ExpressionParser&>,2l>const&>,1l>const&>,2l>>
            (rVar7.t_);
  local_1e0._16_8_ = &local_1b0;
  local_1f0 = (Rule<std::string_()> *)0x61403a;
  local_1e0._0_8_ = &boost::spirit::matches;
  local_1e0._8_8_ = "selective";
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )local_158;
  local_198 = (rule<const_char_*,_franca::SkipGrammar,_boost::variant<fidler::ast::ArrayType,_fidler::ast::EnumerationType,_fidler::ast::StructType,_fidler::ast::UnionType,_fidler::ast::MapType,_fidler::ast::AliasType>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
               *)0x610d77;
  local_1c8._8_8_ = &local_198;
  local_1b8 = &local_168;
  local_1b0.members._0_8_ = (undefined8)(local_1e0 + 0x20);
  local_1b0._8_8_ = &local_148;
  local_1c8._0_8_ = &local_70;
  local_230._M_string_length = (size_type)local_60;
  local_158[0] = 0x7b;
  local_168.manager._0_1_ = 0x7b;
  local_70.manager._0_1_ = 0x7d;
  local_60[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_60[0]._1_7_,0x7d);
  local_1e8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )pAVar3;
  local_208.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )eVar6.child0.ref.t_;
  local_148.child0.ref.t_ = (proto_child0)(proto_child0)local_188._24_8_;
  local_188._0_8_ = local_1e0 + 0x10;
  local_240.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_200;
  local_230._M_dataplus._M_p = &stack0xfffffffffffffda8;
  local_210.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_1f0;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_210;
  local_1f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_1e0;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::Broadcast(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[10]>,0l>,franca::AnnotationGrammar&>,2l>const&,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<bo___exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>>
            (local_120.t_);
  pIVar10 = local_c8;
  rVar4.t_ = local_f8.t_;
  local_210.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)0x614044;
  local_208.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_f8.t_;
  local_1e0[0x10] = 0x5b;
  local_1b0.data[0] = ']';
  local_1e0._0_8_ = (long)local_1e0 + 0x10;
  local_1f0 = (Rule<std::string_()> *)&boost::spirit::matches;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )eVar6.child0.ref.t_;
  local_1c8[8] = '=';
  local_230._M_string_length = (size_type)local_c8;
  local_240.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)&local_200;
  local_230._M_dataplus._M_p = &stack0xfffffffffffffda8;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)&local_210;
  local_1f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_1f0;
  local_1e8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_1e0;
  local_1e0._8_8_ = &local_1b0;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::ConstantDef(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const(&)[6]>,0l>,franca::TypeParser&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::matches>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&>,2l>const&>,2l>const&>,2l>const&,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&,franca::InitializerParser&>,2l>>
            (local_130.t_);
  local_1e0[0x10] = 0x5b;
  local_1b0.data[0] = ']';
  local_210.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(local_1e0 + 0x10);
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&boost::spirit::matches;
  local_240.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )rVar4.t_;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_200;
  local_1c8[8] = '=';
  local_1e8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )pIVar10;
  local_230._M_dataplus._M_p = &stack0xfffffffffffffda8;
  local_230._M_string_length = (size_type)local_1e0;
  local_208.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_1b0;
  local_1f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_210;
  local_1f0 = (Rule<std::string_()> *)(local_1e0 + 0x20);
  local_1e0._0_8_ = &local_1f0;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,fidler::ast::Argument(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<franca::TypeParser&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::matches>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&>,2l>const&>,2l>const&>,2l>const&,boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>,franca::InitializerParser&>,2l>const&>,1l>const&>,2l>>
            (local_188._24_8_);
  local_1f0 = (Rule<std::string_()> *)CONCAT71(local_1f0._1_7_,0x22);
  local_1e0[0] = 0x22;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&boost::spirit::standard::char_;
  local_1e0[0x10] = 0x22;
  local_230._M_dataplus._M_p = "";
  local_240.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_1f0;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_210;
  local_230._M_string_length = (size_type)&stack0xfffffffffffffda8;
  local_210.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_200;
  local_1f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )local_1e0;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::lexeme>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::greater,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::unary_plus,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::minus,boost::proto::argsns_::list2<boost::spirit::terminal<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,1l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,2l>>
            (local_138);
  local_240.ref.t_._0_1_ = 0x2e;
  local_230._M_dataplus._M_p = "";
  local_230._M_string_length = (size_type)&stack0xfffffffffffffda8;
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::raw>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::modulus,boost::proto::argsns_::list2<boost::spirit::qi::rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<char_const&>,0l>>,2l>const&>,2l>>
            (local_188._16_8_);
  local_1f8.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&local_1b0;
  local_1e0[0x10] = 0x5e;
  local_1f0 = (Rule<std::string_()> *)(local_1e0 + 0x10);
  local_1b0.data[0] = 0x5f;
  local_200.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&boost::spirit::standard::alpha;
  local_1c8[8] = 0x5f;
  local_210.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::TypeCollection_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )&boost::spirit::standard::alnum;
  local_1e0._0_8_ = &local_210;
  pVar11.child0.fp = (proto_child0)&local_240;
  puVar12 = local_1e0;
  local_230._M_dataplus._M_p = "";
  local_240.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::Enumerator_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )&local_1f0;
  local_238.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>
          *)&local_200;
  local_230._M_string_length = (size_type)&stack0xfffffffffffffda8;
  local_208.ref.t_ =
       (reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
        )(reference_wrapper<const_boost::spirit::qi::rule<const_char_*,_franca::SkipGrammar,_fidler::ast::IntegerInterval_(),_boost::spirit::unused_type,_boost::spirit::unused_type>_>
          )(local_1e0 + 0x20);
  boost::spirit::qi::
  rule<char_const*,franca::SkipGrammar,std::__cxx11::string(),boost::spirit::unused_type,boost::spirit::unused_type>
  ::
  define<mpl_::bool_<true>,boost::proto::exprns_::expr<boost::proto::tagns_::tag::subscript,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::lexeme>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::shift_right,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::negate,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::lit,boost::fusion::vector<char>>>,0l>const&>,1l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alpha,boost::spirit::char_encoding::standard>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>,boost::fusion::vector<char>>>,0l>const&>,2l>const&>,2l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::dereference,boost::proto::argsns_::list1<boost::proto::exprns_::expr<boost::proto::tagns_::tag::bitwise_or,boost::proto::argsns_::list2<boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::tag::char_code<boost::spirit::tag::alnum,boost::spirit::char_encoding::standard>>,0l>const&,boost::proto::exprns_::expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::spirit::terminal_ex<boost::spirit::tag::char_code<boost::spirit::tag::char_,boost::spirit::char_encoding::standard>,boost::fusion::vector<char>>>,0l>const&>,2l>const&>,1l>const&>,2l>const&>,2l>>
            (eVar6.child0.ref.t_);
  f.proto_expr_._8_8_ = puVar12;
  f.proto_expr_.child0.child0.fp = pVar11.child0.fp;
  boost::spirit::qi::
  on_error<(boost::spirit::qi::error_handler_result)0,char_const*,franca::SkipGrammar,fidler::ast::Model(),boost::spirit::unused_type,boost::phoenix::actor<boost::proto::exprns_::basic_expr<boost::phoenix::detail::tag::function_eval,boost::proto::argsns_::list5<boost::proto::exprns_::basic_expr<boost::proto::tagns_::tag::terminal,boost::proto::argsns_::term<boost::phoenix::detail::function_ptr<void,void(*)(char_const*,char_const*,char_const*,boost::spirit::info_const&)>>,0l>,boost::phoenix::actor<boost::spirit::argument<0>>,boost::phoenix::actor<boost::spirit::argument<1>>,boost::phoenix::actor<boost::spirit::argument<2>>,boost::phoenix::actor<boost::spirit::argument<3>>>,5l>>>
            (local_c0,f);
  return;
}

Assistant:

ModelParser::ModelParser() :
		ModelParser::base_type(model_)
{
	namespace qi = boost::spirit::qi;
	using namespace boost::spirit::qi::labels;
	using boost::phoenix::at_c;
	using boost::phoenix::push_back;

	model_
		= "package"
		> fqn_                 [at_c<0>(_val) = _1]
		> *import_             [push_back(at_c<1>(_val), _1)]
		> *( type_collection_  [push_back(at_c<2>(_val), _1)]
		   | interface_        [push_back(at_c<3>(_val), _1)]
		   )
		> qi::eoi
		;

	import_
		= "import"
		//> qi::omit["model" | (qi::lexeme[fqn_ > -qi::lit(".*")] > "from")]
		> qi::omit["model" | (fqn_ > -qi::lit(".*") > "from")]
		> quoted_string_
		;

	type_collection_
		%= "typeCollection"
		> annotation_
		> -id_
		> '{'
		> -version_
		> *type_definition_
		> *constant_def_
		> '}'
		;

	interface_
		%= "interface"
		> annotation_
		> id_
		> -("extends" > fqn_)
		> -("manages" > (id_ % ','))
		> '{'
		> -version_
		> *attribute_
		> *method_
		> *broadcast_
		> -contract_
		> *type_definition_
		> *constant_def_
		> '}'
		;

	version_
		%= qi::lit("version")
		> '{'
		> qi::lit("major") > qi::int_
		> qi::lit("minor") > qi::int_
		> '}'
		;

	attribute_
		%= "attribute"
		> annotation_
		> type_
		> qi::matches[qi::lit('[') > qi::lit(']')]
		> id_
		> qi::matches["readonly"]
		> qi::matches["noSubscriptions"]
		;

	method_
		%= "method"
		> annotation_
		> id_
		> qi::matches["fireAndForget"]
		> '{'
		> -(qi::lit("in")  > '{' > *argument_ > '}')
		> -(qi::lit("out") > '{' > *argument_ > '}')
		> -("error" > error_)
		> '}'
		;

	error_
		%= fqn_
		| ('{' > *enumerator_ > '}')
		;

	enumerator_
		%= id_
		>> -('=' > expression_)
		;

	broadcast_
		%= "broadcast"
		> annotation_
		> id_
		> qi::matches["selective"]
		> '{'
		> -(qi::lit("out") > '{' > *argument_ > '}')
		> '}'
		;

	constant_def_
		%= "const"
		> type_
		> qi::matches[qi::lit('[') > qi::lit(']')]
		> id_
		> '='
		> initializer_
		;

	argument_
		%= type_
		> qi::matches[qi::lit('[') > qi::lit(']')]
		> id_
		> -('=' > initializer_)
		;

	quoted_string_
		%= qi::lexeme['"' > +(qi::char_ - '"') > '"']
		;

	fqn_
		%= qi::raw[id_ % '.']
		//%= qi::lexeme[id_ % '.']
		;

	id_
		%= qi::lexeme[-qi::lit('^') >> (qi::alpha | qi::char_('_')) >> *(qi::alnum | qi::char_('_'))]
		;

	qi::on_error<qi::fail>(model_,
			boost::phoenix::bind(error_handler, _1, _2, _3, _4));
}